

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_OES_draw_texture(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_OES_draw_texture != 0) {
    glad_glDrawTexsOES = (PFNGLDRAWTEXSOESPROC)(*load)("glDrawTexsOES");
    glad_glDrawTexiOES = (PFNGLDRAWTEXIOESPROC)(*load)("glDrawTexiOES");
    glad_glDrawTexxOES = (PFNGLDRAWTEXXOESPROC)(*load)("glDrawTexxOES");
    glad_glDrawTexsvOES = (PFNGLDRAWTEXSVOESPROC)(*load)("glDrawTexsvOES");
    glad_glDrawTexivOES = (PFNGLDRAWTEXIVOESPROC)(*load)("glDrawTexivOES");
    glad_glDrawTexxvOES = (PFNGLDRAWTEXXVOESPROC)(*load)("glDrawTexxvOES");
    glad_glDrawTexfOES = (PFNGLDRAWTEXFOESPROC)(*load)("glDrawTexfOES");
    glad_glDrawTexfvOES = (PFNGLDRAWTEXFVOESPROC)(*load)("glDrawTexfvOES");
  }
  return;
}

Assistant:

static void load_GL_OES_draw_texture(GLADloadproc load) {
	if(!GLAD_GL_OES_draw_texture) return;
	glad_glDrawTexsOES = (PFNGLDRAWTEXSOESPROC)load("glDrawTexsOES");
	glad_glDrawTexiOES = (PFNGLDRAWTEXIOESPROC)load("glDrawTexiOES");
	glad_glDrawTexxOES = (PFNGLDRAWTEXXOESPROC)load("glDrawTexxOES");
	glad_glDrawTexsvOES = (PFNGLDRAWTEXSVOESPROC)load("glDrawTexsvOES");
	glad_glDrawTexivOES = (PFNGLDRAWTEXIVOESPROC)load("glDrawTexivOES");
	glad_glDrawTexxvOES = (PFNGLDRAWTEXXVOESPROC)load("glDrawTexxvOES");
	glad_glDrawTexfOES = (PFNGLDRAWTEXFOESPROC)load("glDrawTexfOES");
	glad_glDrawTexfvOES = (PFNGLDRAWTEXFVOESPROC)load("glDrawTexfvOES");
}